

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void pcache1Cachesize(sqlite3_pcache *p,int nMax)

{
  long lVar1;
  int iVar2;
  
  if (*(int *)(p + 0x1c) != 0) {
    lVar1 = *(long *)p;
    iVar2 = (nMax - *(int *)(p + 0x24)) + *(int *)(lVar1 + 8);
    *(int *)(lVar1 + 8) = iVar2;
    *(int *)(lVar1 + 0x10) = (iVar2 - *(int *)(lVar1 + 0xc)) + 10;
    *(int *)(p + 0x24) = nMax;
    *(uint *)(p + 0x28) = (uint)(nMax * 9) / 10;
    pcache1EnforceMaxPage((PCache1 *)p);
    return;
  }
  return;
}

Assistant:

static void pcache1Cachesize(sqlite3_pcache *p, int nMax){
  PCache1 *pCache = (PCache1 *)p;
  if( pCache->bPurgeable ){
    PGroup *pGroup = pCache->pGroup;
    pcache1EnterMutex(pGroup);
    pGroup->nMaxPage += (nMax - pCache->nMax);
    pGroup->mxPinned = pGroup->nMaxPage + 10 - pGroup->nMinPage;
    pCache->nMax = nMax;
    pCache->n90pct = pCache->nMax*9/10;
    pcache1EnforceMaxPage(pCache);
    pcache1LeaveMutex(pGroup);
  }
}